

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<char,(unsigned_char)3>>::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  KFLOAT32 KVar2;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  void *local_18;
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this_local;
  
  local_18 = this;
  this_local = (LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *)
               __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"X: ");
  KVar2 = KFIXED<char,_(unsigned_char)'\x03'>::GetAsFloat32
                    ((KFIXED<char,_(unsigned_char)__x03_> *)((long)this + 8));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)KVar2);
  poVar1 = std::operator<<(poVar1,",  Y: ");
  KVar2 = KFIXED<char,_(unsigned_char)'\x03'>::GetAsFloat32
                    ((KFIXED<char,_(unsigned_char)__x03_> *)((long)this + 0x18));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)KVar2);
  poVar1 = std::operator<<(poVar1,",  Z: ");
  KVar2 = KFIXED<char,_(unsigned_char)'\x03'>::GetAsFloat32
                    ((KFIXED<char,_(unsigned_char)__x03_> *)((long)this + 0x28));
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)KVar2);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString LE_Vector<Type>::GetAsString() const
{
    KStringStream ss;

    ss << "X: "    << m_X.GetAsFloat32()
       << ",  Y: " << m_Y.GetAsFloat32()
       << ",  Z: " << m_Z.GetAsFloat32()
       << "\n";

    return ss.str();
}